

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGeneratorMocUic::JobParseT::MocFindIncludedHeader
          (string *__return_storage_ptr__,JobParseT *this,WorkerT *wrk,string *includerDir,
          string *includeBase)

{
  cmQtAutoGeneratorMocUic *pcVar1;
  pointer pbVar2;
  pointer pcVar3;
  string *this_00;
  bool bVar4;
  pointer pbVar5;
  string fullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = wrk->Gen_;
  local_40 = __return_storage_ptr__;
  std::operator+(&local_60,includerDir,includeBase);
  bVar4 = BaseSettingsT::FindHeader(&pcVar1->Base_,__return_storage_ptr__,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (!bVar4) {
    pbVar5 = (wrk->Gen_->Moc_).IncludePaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (wrk->Gen_->Moc_).IncludePaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar5 != pbVar2) {
      do {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        pcVar3 = (pbVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar3,pcVar3 + pbVar5->_M_string_length);
        std::__cxx11::string::push_back((char)&local_60);
        std::__cxx11::string::_M_append((char *)&local_60,(ulong)(includeBase->_M_dataplus)._M_p);
        bVar4 = BaseSettingsT::FindHeader(&wrk->Gen_->Base_,local_40,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pbVar5 = pbVar5 + 1;
      } while (!bVar4 && pbVar5 != pbVar2);
    }
  }
  this_00 = local_40;
  if (local_40->_M_string_length != 0) {
    cmQtAutoGenerator::FileSystem::GetRealPath
              (&local_60,&(wrk->Gen_->super_cmQtAutoGenerator).FileSys_,local_40);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return this_00;
}

Assistant:

std::string cmQtAutoGeneratorMocUic::JobParseT::MocFindIncludedHeader(
  WorkerT& wrk, std::string const& includerDir, std::string const& includeBase)
{
  std::string header;
  // Search in vicinity of the source
  if (!wrk.Base().FindHeader(header, includerDir + includeBase)) {
    // Search in include directories
    for (std::string const& path : wrk.Moc().IncludePaths) {
      std::string fullPath = path;
      fullPath.push_back('/');
      fullPath += includeBase;
      if (wrk.Base().FindHeader(header, fullPath)) {
        break;
      }
    }
  }
  // Sanitize
  if (!header.empty()) {
    header = wrk.FileSys().GetRealPath(header);
  }
  return header;
}